

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int getBiomeCenters(Pos *pos,int *siz,int nmax,Generator *g,Range r,int match,int minsiz,int tol,
                   char *stop)

{
  size_t __size;
  Range r_00;
  int iVar1;
  int iVar2;
  void *__s;
  int *piVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  Pos PVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  int local_1cc;
  int local_1c8;
  long local_1b8;
  long local_188;
  int match_local;
  int local_150;
  int iStack_14c;
  int iStack_148;
  int iStack_144;
  int local_140;
  undefined8 local_13c;
  ulong local_130;
  double local_128;
  ulong local_120;
  Pos *local_118;
  int *local_110;
  BiomeFilter bf;
  
  if (minsiz < 2) {
    minsiz = 1;
  }
  __size = (long)(r.sz * r.sx) * 4;
  match_local = match;
  local_118 = pos;
  local_110 = siz;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  iVar13 = 1;
  if (1 < tol) {
    iVar13 = tol;
  }
  local_120 = (ulong)(uint)r.z;
  iVar17 = g->mc;
  local_130 = (ulong)(uint)r.sz;
  iVar1 = iVar13;
  if (iVar17 < 0x16) {
    uVar6 = 8;
    if (0x1f < r.sz + r.sx) {
      uVar6 = 0x20 / (long)r.scale;
    }
    iVar15 = (int)uVar6;
    dVar23 = (double)iVar15;
    dVar20 = floor((double)r.x / dVar23);
    dVar22 = floor((double)r.z / dVar23);
    dVar21 = ceil((double)(r.x + r.sx) / dVar23);
    iVar14 = (int)dVar21 - (int)dVar20;
    dVar21 = ceil((double)(r.z + r.sz) / dVar23);
    iVar18 = (int)dVar21 - (int)dVar22;
    setupBiomeFilter(&bf,iVar17,0,&match_local,1,(int *)0x0,0,(int *)0x0,0);
    local_150 = r.scale;
    local_13c = 0x100000000;
    iStack_144 = iVar15;
    local_140 = iVar15;
    piVar3 = allocCache(g,r);
    uVar19 = 0;
    if (0 < iVar15) {
      uVar19 = uVar6 & 0xffffffff;
    }
    iVar17 = 0;
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    if (iVar18 < 1) {
      iVar18 = 0;
    }
    for (; iVar17 != iVar18; iVar17 = iVar17 + 1) {
      iVar5 = ((int)dVar22 + iVar17) * iVar15;
      iVar2 = 0;
      while ((iVar2 != iVar14 && ((stop == (char *)0x0 || (*stop == '\0'))))) {
        iStack_14c = ((int)dVar20 + iVar2) * iVar15;
        r_00.x = iStack_14c;
        r_00.scale = local_150;
        r_00.z = iVar5;
        r_00.sx = iStack_144;
        r_00.sz = local_140;
        r_00.y = (undefined4)local_13c;
        r_00.sy = local_13c._4_4_;
        iStack_148 = iVar5;
        iVar8 = checkForBiomes(g,piVar3,r_00,0,g->seed,&bf,stop);
        if (iVar8 == 1) {
          iVar8 = (iStack_148 - r.z) * r.sx;
          piVar11 = piVar3;
          for (uVar12 = 0; uVar12 != uVar19; uVar12 = uVar12 + 1) {
            iVar10 = (iStack_148 + (int)uVar12) - r.z;
            if ((-1 < iVar10) && (iVar10 < r.sz)) {
              iVar10 = iStack_14c - r.x;
              for (lVar9 = 0; (uVar6 & 0xffffffff) * 4 - lVar9 != 0; lVar9 = lVar9 + 4) {
                if (iVar10 < r.sx && -1 < iVar10) {
                  *(undefined4 *)((long)__s + (ulong)(uint)(iVar8 + iVar10) * 4) =
                       *(undefined4 *)((long)piVar11 + lVar9);
                }
                iVar10 = iVar10 + 1;
              }
            }
            piVar11 = piVar11 + iStack_144;
            iVar8 = iVar8 + r.sx;
          }
        }
        iVar2 = iVar2 + 1;
      }
    }
    free(piVar3);
    local_1c8 = match;
  }
  else {
    piVar3 = getBiomeParaLimits(iVar17,match);
    if (tol < 2) {
      dVar20 = floor(SQRT((double)minsiz) * 0.5);
      iVar1 = (int)(dVar20 + 1.0);
    }
    local_1c8 = -1;
    uVar6 = local_130;
    for (iVar17 = 0; iVar17 < (int)uVar6; iVar17 = iVar17 + iVar1) {
      iVar14 = 0;
      while ((iVar14 < r.sx && ((stop == (char *)0x0 || (*stop == '\0'))))) {
        for (lVar9 = 0; lVar9 != 0x14; lVar9 = lVar9 + 4) {
          lVar4 = (long)*(int *)((long)&DAT_00125b30 + lVar9);
          dVar20 = sampleDoublePerlin((DoublePerlinNoise *)((long)&g->field_5 + lVar4 * 0x28),
                                      (double)((r.x + iVar14) * r.scale) * 0.25,0.0,
                                      (double)((r.z + iVar17) * r.scale) * 0.25);
          if (((int)(dVar20 * 10000.0) < piVar3[lVar4 * 2]) ||
             (piVar3[lVar4 * 2 + 1] < (int)(dVar20 * 10000.0))) {
            *(undefined4 *)((long)__s + (long)(r.sx * iVar17 + iVar14) * 4) = 0xfffffffe;
            break;
          }
        }
        iVar14 = iVar14 + iVar1;
      }
      uVar6 = (ulong)(uint)r.sz;
    }
  }
  iVar17 = 0;
  applySeed(g,0,g->seed);
  local_128 = (double)r.scale;
  for (iVar14 = 0; iVar14 < r.sz; iVar14 = iVar14 + iVar1) {
    iVar18 = 0;
    while ((iVar18 < r.sx && ((stop == (char *)0x0 || (*stop == '\0'))))) {
      if (*(int *)((long)__s + (long)(r.sx * iVar14 + iVar18) * 4) == local_1c8) {
        piVar3 = (int *)malloc((long)(r.sz * r.sx) * 0xc);
        *piVar3 = iVar18;
        piVar3[1] = iVar14;
        piVar3[2] = 0;
        local_188 = 0;
        uVar16 = 1;
        local_1b8 = 0;
        local_1cc = 0;
        uVar6 = local_120;
        while (0 < (int)uVar16) {
          if ((stop != (char *)0x0) && (*stop != '\0')) {
            free(piVar3);
            goto LAB_0010f8bb;
          }
          uVar19 = (ulong)(uVar16 - 1);
          iVar15 = piVar3[uVar19 * 3];
          iVar5 = piVar3[uVar19 * 3 + 1];
          lVar9 = (long)(iVar5 * r.sx + iVar15);
          iVar2 = *(int *)((long)__s + lVar9 * 4);
          if (iVar2 == 0x7fffffff) {
LAB_0010f6ad:
            uVar16 = uVar16 - 1;
          }
          else {
            iVar8 = piVar3[uVar19 * 3 + 2];
            *(undefined4 *)((long)__s + lVar9 * 4) = 0x7fffffff;
            iVar10 = iVar5 + (int)uVar6;
            if (0x15 < g->mc) {
              iVar2 = getBiomeAt(g,r.scale,iVar15 + r.x,r.y,iVar10);
              uVar6 = local_120;
            }
            if (iVar2 == match) {
              local_188 = local_188 + (iVar15 + r.x);
              local_1b8 = local_1b8 + iVar10;
              local_1cc = local_1cc + 1;
              iVar8 = 0;
            }
            else {
              iVar8 = iVar8 + 1;
              if (iVar13 <= iVar8) goto LAB_0010f6ad;
            }
            bf.tempsToFind._0_4_ = iVar15;
            bf.tempsToFind._4_4_ = iVar5 + -1;
            bf.otempToFind._0_4_ = iVar8;
            bf.otempToFind._4_4_ = iVar15;
            bf.majorToFind._0_4_ = iVar5 + 1;
            bf.majorToFind._4_4_ = iVar8;
            bf.edgesToFind._0_4_ = iVar15 + -1;
            bf.edgesToFind._4_4_ = iVar5;
            bf.raresToFind._0_4_ = iVar8;
            bf.raresToFind._4_4_ = iVar15 + 1;
            bf.raresToFindM._0_4_ = iVar5;
            bf.raresToFindM._4_4_ = iVar8;
            uVar16 = uVar16 - 1;
            for (lVar9 = 0; lVar9 != 0x30; lVar9 = lVar9 + 0xc) {
              iVar15 = *(int *)((long)&bf.tempsToFind + lVar9);
              if ((((-1 < iVar15) && (iVar15 < r.sx)) &&
                  (iVar5 = *(int *)((long)&bf.tempsToFind + lVar9 + 4), -1 < iVar5)) &&
                 ((iVar5 < (int)local_130 &&
                  (*(int *)((long)__s + (ulong)(uint)(iVar5 * r.sx + iVar15) * 4) != 0x7fffffff))))
              {
                lVar4 = (long)(int)uVar16;
                uVar16 = uVar16 + 1;
                piVar3[lVar4 * 3 + 2] = *(int *)((long)&bf.otempToFind + lVar9);
                *(undefined8 *)(piVar3 + lVar4 * 3) = *(undefined8 *)((long)&bf.tempsToFind + lVar9)
                ;
              }
            }
          }
        }
        free(piVar3);
        if (minsiz <= local_1cc) {
          dVar20 = round(((double)local_1b8 / (double)local_1cc + 0.5) * local_128);
          dVar22 = round(((double)local_188 / (double)local_1cc + 0.5) * local_128);
          PVar7.x = (int)dVar22;
          PVar7.z = (int)dVar20;
          local_118[iVar17] = PVar7;
          if (local_110 != (int *)0x0) {
            local_110[iVar17] = local_1cc;
          }
          iVar17 = iVar17 + 1;
          if (nmax <= iVar17) goto LAB_0010f8cf;
        }
      }
LAB_0010f8bb:
      iVar18 = iVar18 + iVar1;
    }
  }
LAB_0010f8cf:
  free(__s);
  return iVar17;
}

Assistant:

int getBiomeCenters(Pos *pos, int *siz, int nmax, Generator *g, Range r,
    int match, int minsiz, int tol, volatile char *stop)
{
    if (minsiz <= 0)
        minsiz = 1;
    int i, j, k, n = 0;
    int *ids = (int*) malloc(r.sx*r.sz * sizeof(int));
    memset(ids, -1, r.sx*r.sz * sizeof(int));
    if (tol <= 0)
        tol = 1;
    int step = tol;
    struct locate_info_t info;
    info.g = g;
    info.ids = ids;
    info.r = r;
    info.stop = stop;
    info.match = match;
    info.tol = tol;

    if (g->mc >= MC_1_18)
    {
        const int *lim = getBiomeParaLimits(g->mc, match);

        int para[] = {
            NP_TEMPERATURE,
            NP_HUMIDITY,
            NP_EROSION,
            NP_CONTINENTALNESS,
            NP_WEIRDNESS,
        };
        int npara = sizeof(para) / sizeof(para[0]);
        if (tol == 1)
            step = 1 + floor(sqrt(minsiz) * 0.5);

        for (j = 0; j < r.sz; j += step)
        {
            for (i = 0; i < r.sx; i += step)
            {
                if (stop && *stop)
                    break;
                for (k = 0; k < npara; k++)
                {
                    const int *plim = lim + 2*para[k];
                    if (plim[0] == INT_MIN && plim[1] == INT_MAX)
                        continue;
                    DoublePerlinNoise *dpn = &g->bn.climate[para[k]];
                    double px = (r.x+i) * r.scale / 4.0;
                    double pz = (r.z+j) * r.scale / 4.0;
                    int p = 10000 * sampleDoublePerlin(dpn, px, 0, pz);
                    if (p < plim[0] || p > plim[1])
                    {
                        ids[j*r.sx + i] = -2;
                        break;
                    }
                }
            }
        }
        match = -1; // id entries that are still -1 are our candidates
    }
    else // 1.17-
    {
        int ts = 32 / r.scale;
        if (r.sx + r.sz < 32)
            ts = 8;

        int tx = (int) floor(r.x / (double)ts);
        int tz = (int) floor(r.z / (double)ts);
        int tw = (int) ceil((r.x+r.sx) / (double)ts) - tx;
        int th = (int) ceil((r.z+r.sz) / (double)ts) - tz;
        int ti, tj;

        BiomeFilter bf;
        setupBiomeFilter(&bf, g->mc, 0, &match, 1, 0, 0, 0, 0);
        //applySeed(g, 0, g->seed);

        Range tr = { r.scale, 0, 0, ts, ts, 0, 1 };
        int *cache = allocCache(g, r);

        for (tj = 0; tj < th; tj++)
        {
            for (ti = 0; ti < tw; ti++)
            {
                if (stop && *stop)
                    break;
                tr.x = (tx+ti) * ts;
                tr.z = (tz+tj) * ts;
                if (checkForBiomes(g, cache, tr, DIM_OVERWORLD, g->seed,
                    &bf, stop) != 1)
                {
                    continue;
                }
                for (j = 0; j < ts; j++)
                {
                    int jj = tr.z + j - r.z;
                    if (jj < 0 || jj >= r.sz)
                        continue;
                    for (i = 0; i < ts; i++)
                    {
                        int ii = tr.x + i - r.x;
                        if (ii < 0 || ii >= r.sx)
                            continue;
                        ids[jj*r.sx + ii] = cache[j*tr.sx + i];
                    }
                }
            }
        }
        free(cache);
    }

    applySeed(g, DIM_OVERWORLD, g->seed);
    for (j = 0; j < r.sz; j += step)
    {
        for (i = 0; i < r.sx; i += step)
        {
            if (stop && *stop)
                break;
            if (ids[j*r.sx + i] != match)
                continue;
            Pos center;
            int area = floodFillGen(&info, i, j, &center);
            if (area >= minsiz)
            {
                pos[n] = center;
                if (siz) siz[n] = area;
                if (++n >= nmax)
                    goto L_end;
            }
        }
    }

L_end:
    free(ids);

    return n;
}